

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTable::~ImGuiTable(ImGuiTable *this)

{
  ImGuiTable *this_local;
  
  ImGui::MemFree(this->RawData);
  ImVector<ImGuiTableColumnSortSpecs>::~ImVector(&this->SortSpecsMulti);
  ImDrawListSplitter::~ImDrawListSplitter(&this->DrawSplitter);
  ImGuiTextBuffer::~ImGuiTextBuffer(&this->ColumnsNames);
  return;
}

Assistant:

IMGUI_API ~ImGuiTable()     { IM_FREE(RawData); }